

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O3

graph * __thiscall mpt::convertable::operator_cast_to_graph_(convertable *this)

{
  int iVar1;
  named_traits *pnVar2;
  uint uVar3;
  graph *local_10;
  
  pnVar2 = layout::graph::pointer_traits(true);
  if (pnVar2 != (named_traits *)0x0) {
    local_10 = (graph *)0x0;
    uVar3 = (uint)pnVar2->type;
    if ((0 < (int)uVar3) &&
       (iVar1 = (**this->_vptr_convertable)(this,(ulong)(uVar3 & 0x7fffffff),&local_10), -1 < iVar1)
       ) {
      return local_10;
    }
  }
  return (graph *)0x0;
}

Assistant:

mpt::convertable::operator T *()
{
	int type = mpt::type_properties<T *>::id(true);
	T *ptr = 0;
	if ((type <= 0) || (convert(type, &ptr) < 0)) {
		return 0;
	}
	return ptr;
}